

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

bool __thiscall semver::detail::version_parser::is_leading_zero(version_parser *this,int digit)

{
  bool bVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  bool local_41;
  token *local_38;
  token token;
  int digits;
  int alpha_numerics;
  int k;
  int digit_local;
  version_parser *this_local;
  
  if (digit == 0) {
    digits = 0;
    token.lexeme._4_4_ = 0;
    token.lexeme._0_4_ = 0;
    while( true ) {
      local_38 = token_stream::peek((token *)this->stream,(token_stream *)(long)digits,in_RDX);
      bVar1 = is_alphanumeric(this,(token *)&local_38);
      if (!bVar1) break;
      token.lexeme._4_4_ = token.lexeme._4_4_ + 1;
      bVar1 = is_digit(this,(token *)&local_38);
      if (bVar1) {
        token.lexeme._0_4_ = (int)token.lexeme + 1;
      }
      digits = digits + 1;
      in_RDX = extraout_RDX;
    }
    local_41 = 0 < (int)token.lexeme && (int)token.lexeme == token.lexeme._4_4_;
    this_local._7_1_ = local_41;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

SEMVER_CONSTEXPR bool is_leading_zero(int digit) noexcept {
    if (digit != 0) {
      return false;
    }

    int k = 0;
    int alpha_numerics = 0;
    int digits = 0;

    while (true) {
      const token token = stream.peek(k);

      if (!is_alphanumeric(token)) {
        break;
      }

      ++alpha_numerics;

      if (is_digit(token)) {
        ++digits;
      }

      ++k;
    }

    return digits > 0 && digits == alpha_numerics;
  }